

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_binary.cpp
# Opt level: O2

void draw(void)

{
  GLuint GVar1;
  GLuint GVar2;
  GLint GVar3;
  GLuint vao;
  GLuint vbo;
  Vertex verts [3];
  GLfloat mat [16];
  
  (*glad_glBindFragDataLocation)(program,0,"f_color");
  (*glad_glUseProgram)(program);
  GVar1 = (*glad_glGetAttribLocation)(program,"pos");
  GVar2 = (*glad_glGetAttribLocation)(program,"color");
  GVar3 = (*glad_glGetUniformLocation)(program,"modelviewProjection");
  verts[2].color[0] = 0.0;
  verts[2].color[1] = 0.0;
  verts[2].color[2] = 0.7;
  verts[1].color[1] = 0.9;
  verts[1].color[2] = 0.0;
  verts[2].pos[0] = 0.0;
  verts[2].pos[1] = 0.9;
  verts[0].color[2] = 0.0;
  verts[1].pos[0] = 0.9;
  verts[1].pos[1] = -0.9;
  verts[1].color[0] = 0.0;
  verts[0].pos[0] = -0.9;
  verts[0].pos[1] = -0.9;
  verts[0].color[0] = 0.8;
  verts[0].color[1] = 0.0;
  mat[2] = 0.0;
  mat[3] = 0.0;
  mat[6] = 0.0;
  mat[7] = 0.0;
  mat[8] = 0.0;
  mat[9] = 0.0;
  mat[0xc] = 0.0;
  mat[0xd] = 0.0;
  mat[0] = 1.0;
  mat[1] = 0.0;
  mat[4] = 0.0;
  mat[5] = 1.0;
  mat[10] = 1.0;
  mat[0xb] = 0.0;
  mat[0xe] = 0.0;
  mat[0xf] = 1.0;
  (*glad_glGenBuffers)(1,&vbo);
  (*glad_glUniformMatrix4fv)(GVar3,1,'\0',mat);
  (*glad_glClear)(0x4000);
  (*glad_glGenVertexArrays)(1,&vao);
  (*glad_glBindVertexArray)(vao);
  (*glad_glBindBuffer)(0x8892,vbo);
  (*glad_glBufferData)(0x8892,0x3c,verts,0x88e4);
  (*glad_glVertexAttribPointer)(GVar1,2,0x1406,'\0',0x14,(void *)0x0);
  (*glad_glEnableVertexAttribArray)(GVar1);
  (*glad_glVertexAttribPointer)(GVar2,3,0x1406,'\0',0x14,(void *)0x8);
  (*glad_glEnableVertexAttribArray)(GVar2);
  (*glad_glDrawArrays)(4,0,3);
  (*glad_glDisableVertexAttribArray)(GVar1);
  (*glad_glDisableVertexAttribArray)(GVar2);
  (*glad_glUseProgram)(0);
  glfwSwapBuffers(window);
  return;
}

Assistant:

static void
draw(void)
{
    GLint u_matrix = -1;
    GLint attr_pos = 0, attr_color = 1;

    glBindFragDataLocation(program, 0, "f_color");

    glUseProgram(program);

    attr_pos = glGetAttribLocation(program, "pos");
    attr_color = glGetAttribLocation(program, "color");

    u_matrix = glGetUniformLocation(program, "modelviewProjection");
    struct Vertex {
        GLfloat pos[2];
        GLfloat color[3];
    };

    const Vertex verts[] = {
        { { -0.9f, -0.9f }, {  0.8f, 0.0f, 0.0f } },
        { {  0.9f, -0.9f }, {  0.0f, 0.9f, 0.0f } },
        { {  0.0f,  0.9f }, {  0.0f, 0.0f, 0.7f } }
    };
    GLuint vbo;

    const GLfloat mat[16] = {
        1.0f, 0.0f, 0.0f, 0.0f,
        0.0f, 1.0f, 0.0f, 0.0f, 
        0.0f, 0.0f, 1.0f, 0.0f,
        0.0f, 0.0f, 0.0f, 1.0f
    };

    glGenBuffers(1, &vbo);

    /* Set modelview/projection matrix */
    glUniformMatrix4fv(u_matrix, 1, GL_FALSE, mat);

    glClear(GL_COLOR_BUFFER_BIT);

    GLuint vao;
    glGenVertexArrays(1, &vao);
    glBindVertexArray(vao);

    glBindBuffer(GL_ARRAY_BUFFER, vbo);
    glBufferData(GL_ARRAY_BUFFER, sizeof verts, verts, GL_STATIC_DRAW);

    glVertexAttribPointer(attr_pos, ARRAY_SIZE(verts[0].pos), GL_FLOAT, GL_FALSE, sizeof(Vertex), (void *)offsetof(Vertex, pos));
    glEnableVertexAttribArray(attr_pos);

    glVertexAttribPointer(attr_color, ARRAY_SIZE(verts[0].color), GL_FLOAT, GL_FALSE, sizeof(Vertex), (void *)offsetof(Vertex, color));
    glEnableVertexAttribArray(attr_color);

    glDrawArrays(GL_TRIANGLES, 0, 3);

    glDisableVertexAttribArray(attr_pos);
    glDisableVertexAttribArray(attr_color);

    glUseProgram(0);

    glfwSwapBuffers(window);
}